

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SpectrumTextureHandle __thiscall
pbrt::SpectrumTextureHandle::Create
          (SpectrumTextureHandle *this,string *name,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,SpectrumType spectrumType,FileLoc *loc,
          Allocator alloc,bool gpu)

{
  int iVar1;
  uintptr_t iptr;
  SpectrumPtexTexture *pSVar2;
  ulong uVar3;
  SpectrumImageTexture *pSVar4;
  MarbleTexture *pMVar5;
  FileLoc *loc_00;
  FileLoc *loc_01;
  Transform *pTVar6;
  char *fmt;
  undefined4 in_register_00000084;
  FileLoc *loc_02;
  long in_FS_OFFSET;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  local_38;
  
  loc_02 = (FileLoc *)CONCAT44(in_register_00000084,spectrumType);
  loc_00 = (FileLoc *)parameters;
  pTVar6 = (Transform *)name;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    pSVar2 = (SpectrumPtexTexture *)
             SpectrumConstantTexture::Create(pTVar6,parameters,spectrumType,loc_00,alloc);
    uVar3 = 0x5000000000000;
    goto LAB_0032b994;
  }
  pTVar6 = (Transform *)0x2c83e62;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    SpectrumScaledTexture::Create
              ((SpectrumScaledTexture *)&local_38,pTVar6,parameters,spectrumType,loc_02,alloc);
LAB_0032b997:
    (this->
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    ).bits = local_38.bits;
  }
  else {
    pTVar6 = (Transform *)name;
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      pSVar2 = (SpectrumPtexTexture *)
               SpectrumMixTexture::Create(pTVar6,parameters,spectrumType,loc_00,alloc);
      uVar3 = 0x3000000000000;
LAB_0032b994:
      local_38.bits = uVar3 | (ulong)pSVar2;
      goto LAB_0032b997;
    }
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      pSVar2 = (SpectrumPtexTexture *)
               SpectrumBilerpTexture::Create(renderFromTexture,parameters,spectrumType,loc,alloc);
      uVar3 = 0x6000000000000;
      goto LAB_0032b994;
    }
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        pSVar2 = (SpectrumPtexTexture *)
                 SpectrumCheckerboardTexture::Create
                           (renderFromTexture,parameters,spectrumType,loc,alloc);
        uVar3 = 0x7000000000000;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          pSVar2 = (SpectrumPtexTexture *)
                   SpectrumDotsTexture::Create(renderFromTexture,parameters,spectrumType,loc,alloc);
          uVar3 = 0x9000000000000;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 == 0) {
            pMVar5 = MarbleTexture::Create(renderFromTexture,parameters,loc_01,alloc);
            local_38.bits = (ulong)pMVar5 | 0x8000000000000;
            goto LAB_0032b997;
          }
          pTVar6 = (Transform *)name;
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 != 0) {
            fmt = "%s: spectrum texture type unknown.";
            goto LAB_0032b9e0;
          }
          if (gpu) {
            ErrorExit(loc,"ptex texture is not supported on the GPU.");
          }
          pSVar2 = SpectrumPtexTexture::Create(pTVar6,parameters,spectrumType,loc_00,alloc);
          uVar3 = 0xa000000000000;
        }
      }
      goto LAB_0032b994;
    }
    if (gpu) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.h"
               ,0x2df,"GPUSpectrumImageTexture::Create called in non-GPU configuration.");
    }
    pSVar4 = SpectrumImageTexture::Create(renderFromTexture,parameters,spectrumType,loc,alloc);
    local_38.bits = (ulong)pSVar4 | 0x1000000000000;
    (this->
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    ).bits = local_38.bits;
  }
  if ((local_38.bits & 0xffffffffffff) != 0) {
    *(long *)(in_FS_OFFSET + -0x1b8) = *(long *)(in_FS_OFFSET + -0x1b8) + 1;
    return (SpectrumTextureHandle)
           (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
            )this;
  }
  fmt = "%s: unable to create texture.";
LAB_0032b9e0:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

SpectrumTextureHandle SpectrumTextureHandle::Create(
    const std::string &name, const Transform &renderFromTexture,
    const TextureParameterDictionary &parameters, SpectrumType spectrumType,
    const FileLoc *loc, Allocator alloc, bool gpu) {
    SpectrumTextureHandle tex;
    if (name == "constant")
        tex = SpectrumConstantTexture::Create(renderFromTexture, parameters, spectrumType,
                                              loc, alloc);
    else if (name == "scale")
        tex = SpectrumScaledTexture::Create(renderFromTexture, parameters, spectrumType,
                                            loc, alloc);
    else if (name == "mix")
        tex = SpectrumMixTexture::Create(renderFromTexture, parameters, spectrumType, loc,
                                         alloc);
    else if (name == "bilerp")
        tex = SpectrumBilerpTexture::Create(renderFromTexture, parameters, spectrumType,
                                            loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUSpectrumImageTexture::Create(renderFromTexture, parameters,
                                                  spectrumType, loc, alloc);
        else
            tex = SpectrumImageTexture::Create(renderFromTexture, parameters,
                                               spectrumType, loc, alloc);
    } else if (name == "checkerboard")
        tex = SpectrumCheckerboardTexture::Create(renderFromTexture, parameters,
                                                  spectrumType, loc, alloc);
    else if (name == "dots")
        tex = SpectrumDotsTexture::Create(renderFromTexture, parameters, spectrumType,
                                          loc, alloc);
    else if (name == "marble")
        tex = MarbleTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            ErrorExit(loc, "ptex texture is not supported on the GPU.");
        else
            tex = SpectrumPtexTexture::Create(renderFromTexture, parameters, spectrumType,
                                              loc, alloc);
    } else
        ErrorExit(loc, "%s: spectrum texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    // FIXME: reenable this once we handle all the same image texture parameters
    // CO    parameters.ReportUnused();
    return tex;
}